

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.hpp
# Opt level: O3

int __thiscall io::posix::mmap_file::open(mmap_file *this,char *__file,int __oflag,...)

{
  int iVar1;
  system_error *this_00;
  uint in_ECX;
  error_code __ec;
  error_code ec;
  uint local_38 [2];
  error_category *local_30;
  
  local_38[0] = 0;
  local_30 = (error_category *)std::_V2::system_category();
  iVar1 = open(this,__file,__oflag,(ulong)in_ECX,local_38);
  if (local_38[0] == 0) {
    return iVar1;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_38[0];
  __ec._M_cat = local_30;
  std::system_error::system_error(this_00,__ec);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void open(const io_std::filesystem::path& path,
              open_mode mode,
              io_std::filesystem::perms create_perms = default_creation_perms)
    {
        std::error_code ec;
        this->open(path, mode, create_perms, ec);
        if (ec) {
            throw std::system_error{ec};
        }
    }